

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cpp
# Opt level: O2

void anon_unknown.dwarf_1a9df3::DirectorySearch(char *path,char *ext,vector<std::string> *results)

{
  pointer pbVar1;
  pointer pbVar2;
  int iVar3;
  DIR *__dirp;
  size_t sVar4;
  dirent *pdVar5;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  
  if (2 < (int)gLogLevel) {
    fprintf((FILE *)gLogFile,"[ALSOFT] (II) Searching %s for *%s\n",path,ext);
  }
  __dirp = opendir(path);
  if (__dirp != (DIR *)0x0) {
    uVar7 = (long)(results->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(results->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                  )._M_impl.super__Vector_impl_data._M_start;
    sVar4 = strlen(ext);
    while( true ) {
      pdVar5 = readdir(__dirp);
      if (pdVar5 == (dirent *)0x0) break;
      if ((pdVar5->d_name[0] != '.') ||
         ((pdVar5->d_name[1] != '\0' && ((pdVar5->d_name[1] != '.' || (pdVar5->d_name[2] != '\0'))))
         )) {
        sVar6 = strlen(pdVar5->d_name);
        if (sVar4 < sVar6) {
          iVar3 = al::strcasecmp(pdVar5->d_name + (sVar6 - sVar4),ext);
          if (iVar3 == 0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
            ::emplace_back<>(results);
            pbVar1 = (results->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            pbVar2 = pbVar1 + -1;
            std::__cxx11::string::assign((char *)pbVar2);
            if (pbVar1[-1]._M_dataplus._M_p[pbVar1[-1]._M_string_length - 1] != '/') {
              std::__cxx11::string::push_back((char)pbVar2);
            }
            std::__cxx11::string::append((char *)pbVar2);
          }
        }
      }
    }
    closedir(__dirp);
    pbVar2 = (results->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar10 = (long)(results->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2;
    lVar9 = (long)pbVar2 + uVar7;
    std::__sort<std::__cxx11::string*,__gnu_cxx::__ops::_Iter_less_iter>
              (lVar9,((uVar10 >> 5) - (uVar7 >> 5)) * 0x20 + lVar9);
    for (lVar8 = 0; uVar10 - uVar7 != lVar8; lVar8 = lVar8 + 0x20) {
      if (2 < (int)gLogLevel) {
        fprintf((FILE *)gLogFile,"[ALSOFT] (II)  got %s\n",*(undefined8 *)(lVar9 + lVar8));
      }
    }
  }
  return;
}

Assistant:

void DirectorySearch(const char *path, const char *ext, al::vector<std::string> *const results)
{
    TRACE("Searching %s for *%s\n", path, ext);
    DIR *dir{opendir(path)};
    if(!dir) return;

    const auto base = results->size();
    const size_t extlen{strlen(ext)};

    while(struct dirent *dirent{readdir(dir)})
    {
        if(strcmp(dirent->d_name, ".") == 0 || strcmp(dirent->d_name, "..") == 0)
            continue;

        const size_t len{strlen(dirent->d_name)};
        if(len <= extlen) continue;
        if(al::strcasecmp(dirent->d_name+len-extlen, ext) != 0)
            continue;

        results->emplace_back();
        std::string &str = results->back();
        str = path;
        if(str.back() != '/')
            str.push_back('/');
        str += dirent->d_name;
    }
    closedir(dir);

    const al::span<std::string> newlist{results->data()+base, results->size()-base};
    std::sort(newlist.begin(), newlist.end());
    for(const auto &name : newlist)
        TRACE(" got %s\n", name.c_str());
}